

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void collect_init_els(c2m_ctx_t c2m_ctx,decl_t member_decl,type **type_ptr,
                     node_t_conflict initializer,int const_only_p,int top_p)

{
  node_code_t nVar1;
  undefined4 uVar2;
  type_mode tVar3;
  gen_ctx_conflict *pgVar4;
  type *ptVar5;
  node_t pnVar6;
  byte *pbVar7;
  VARR_init_el_t *pVVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [48];
  bool bVar12;
  int iVar13;
  int iVar14;
  node_t_conflict pnVar15;
  mir_llong mVar16;
  undefined8 *puVar17;
  init_object_t *piVar18;
  ulong uVar19;
  init_el_t *__ptr;
  mir_size_t mVar20;
  long lVar21;
  VARR_init_object_t *pVVar22;
  node_t pnVar23;
  ulong uVar24;
  node_t_conflict n;
  c2m_ctx_t pcVar25;
  size_t sVar26;
  size_t sVar27;
  type *ptVar28;
  node_t pnVar29;
  pos_t pVar30;
  int addr_p;
  undefined4 local_90;
  undefined4 uStack_8c;
  char *pcStack_88;
  node_t_conflict pnStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  symbol_t el;
  
  pgVar4 = c2m_ctx->gen_ctx;
  ptVar5 = *type_ptr;
  addr_p = 0;
  pnVar15 = get_compound_literal(initializer,&addr_p);
  iVar14 = addr_p;
  if ((addr_p == 0 && pnVar15 != (node_t_conflict)0x0) && (2 < initializer->code - N_STR)) {
    pnVar23 = (pnVar15->u).ops.head;
    if (pnVar23 == (node_t)0x0) {
      initializer = (node_t)0x0;
    }
    else {
      initializer = (pnVar23->op_link).next;
    }
  }
  bVar12 = top_p == 0;
  do {
    bVar10 = bVar12;
    nVar1 = initializer->code;
    if (nVar1 != N_LIST) {
      if (nVar1 == N_STR) {
        if ((ptVar5->mode == TM_ARR) &&
           (iVar13 = init_compatible_string_p
                               ((node_t_conflict)&DAT_0000000d,((ptVar5->u).ptr_type)->arr_type),
           iVar13 != 0)) {
          pnVar23 = (initializer->u).ops.head;
          n = (node_t_conflict)&DAT_0000000d;
LAB_001a773e:
          iVar13 = init_compatible_string_p(n,((ptVar5->u).ptr_type)->arr_type);
          if (iVar13 == 0) {
            if (pnVar23 == (node_t)0x0) {
              return;
            }
            goto LAB_001a7784;
          }
          if (pgVar4->init_els == (VARR_init_el_t *)0x0) goto LAB_001a8073;
          mVar20 = pgVar4->init_els->els_num;
          pcVar25 = c2m_ctx;
          puVar17 = (undefined8 *)get_object_path_offset(c2m_ctx);
          pVVar22 = c2m_ctx->init_object_path;
          if (pVVar22 == (VARR_init_object_t *)0x0) goto LAB_001a8078;
          if (pVVar22->els_num == 0) {
            ptVar28 = (type *)0x0;
          }
          else {
            if (pVVar22->varr == (init_object_t *)0x0) {
              collect_init_els_cold_1();
              if (pcVar25 != (c2m_ctx_t)0x0) {
                return;
              }
              VARR_init_el_taddr_cold_1();
              lVar9 = pcVar25->env[0].__jmpbuf[1];
              if ((lVar9 == 0) || ((int)*(uint *)(lVar9 + 4) < 0)) {
                uVar19 = 0;
              }
              else {
                uVar19 = (ulong)(*(uint *)(lVar9 + 4) >> 3);
              }
              lVar21 = puVar17[3];
              if ((lVar21 == 0) || ((int)*(uint *)(lVar21 + 4) < 0)) {
                uVar24 = 0;
              }
              else {
                uVar24 = (ulong)(*(uint *)(lVar21 + 4) >> 3);
              }
              uVar19 = uVar19 + pcVar25->env[0].__jmpbuf[0];
              if ((uVar24 + puVar17[2] <= uVar19) && (uVar19 <= uVar24 + puVar17[2])) {
                if (lVar9 != 0) {
                  if (lVar21 != 0) {
                    if (*(int *)(lVar9 + 4) < *(int *)(lVar21 + 4)) {
                      return;
                    }
                    if (*(int *)(lVar21 + 4) < *(int *)(lVar9 + 4)) {
                      return;
                    }
                  }
                  ptVar5 = *(type **)(lVar9 + 0x40);
                  mVar20 = raw_type_size((c2m_ctx_t)pcVar25->ctx,ptVar5);
                  uVar19 = (ulong)ptVar5->align;
                  if (uVar19 != 0) {
                    uVar24 = (mVar20 - 1) + uVar19;
                    mVar20 = uVar24 - uVar24 % uVar19;
                  }
                  if (mVar20 == 0) {
                    return;
                  }
                  lVar21 = puVar17[3];
                }
                if (lVar21 != 0) {
                  raw_type_size((c2m_ctx_t)*puVar17,*(type **)(lVar21 + 0x40));
                }
              }
              return;
            }
            ptVar28 = pVVar22->varr[pVVar22->els_num - 1].container_type;
          }
          pVVar8 = pgVar4->init_els;
          __ptr = pVVar8->varr;
          if (__ptr != (init_el_t *)0x0) {
            sVar26 = pVVar8->els_num;
            uVar19 = sVar26 + 1;
            if (pVVar8->size < uVar19) {
              sVar27 = (uVar19 >> 1) + uVar19;
              __ptr = (init_el_t *)realloc(__ptr,sVar27 * 0x38);
              pVVar8->varr = __ptr;
              pVVar8->size = sVar27;
              sVar26 = pVVar8->els_num;
              uVar19 = sVar26 + 1;
            }
            pVVar8->els_num = uVar19;
            __ptr[sVar26].c2m_ctx = c2m_ctx;
            __ptr[sVar26].num = mVar20;
            __ptr[sVar26].offset = (mir_size_t)puVar17;
            __ptr[sVar26].member_decl = (decl_t)0x0;
            goto LAB_001a7e89;
          }
          goto LAB_001a807d;
        }
      }
      else if (((1 < nVar1 - N_STR) && (const_only_p != 0)) && (nVar1 != N_STR32)) {
        if (((*initializer->attr & 3) == 0) && (pnVar15 == (node_t_conflict)0x0 || iVar14 == 0)) {
          __assert_fail("initializer->code == N_STR || initializer->code == N_STR16 || initializer->code == N_STR32 || !const_only_p || cexpr->const_p || cexpr->const_addr_p || (literal != NULL && addr_p)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2ccf,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
      }
      if (pgVar4->init_els == (VARR_init_el_t *)0x0) goto LAB_001a8055;
      sVar27 = pgVar4->init_els->els_num;
      mVar20 = get_object_path_offset(c2m_ctx);
      pVVar22 = c2m_ctx->init_object_path;
      if (pVVar22 == (VARR_init_object_t *)0x0) goto LAB_001a805a;
      if (pVVar22->els_num == 0) {
        ptVar28 = (type *)0x0;
      }
      else {
        if (pVVar22->varr == (init_object_t *)0x0) goto LAB_001a8064;
        ptVar28 = pVVar22->varr[pVVar22->els_num - 1].container_type;
      }
      pVVar8 = pgVar4->init_els;
      __ptr = pVVar8->varr;
      if (__ptr != (init_el_t *)0x0) {
        sVar26 = pVVar8->els_num;
        uVar19 = sVar26 + 1;
        if (pVVar8->size < uVar19) {
          sVar26 = (uVar19 >> 1) + uVar19;
          __ptr = (init_el_t *)realloc(__ptr,sVar26 * 0x38);
          pVVar8->varr = __ptr;
          pVVar8->size = sVar26;
          sVar26 = pVVar8->els_num;
          uVar19 = sVar26 + 1;
        }
        pVVar8->els_num = uVar19;
        __ptr[sVar26].c2m_ctx = c2m_ctx;
        __ptr[sVar26].num = sVar27;
        __ptr[sVar26].offset = mVar20;
        __ptr[sVar26].member_decl = member_decl;
LAB_001a7e89:
        __ptr[sVar26].el_type = ptVar5;
        __ptr[sVar26].container_type = ptVar28;
        __ptr[sVar26].init = initializer;
        return;
      }
      goto LAB_001a805f;
    }
    pnVar23 = (initializer->u).ops.head;
    if (pnVar23 == (node_t)0x0) {
      return;
    }
    if (pnVar23->code != N_INIT) goto LAB_001a7f96;
    if ((pnVar23->op_link).next == (node_t)0x0) {
      pnVar29 = (pnVar23->u).ops.head;
      if ((pnVar29->code == N_LIST) && ((pnVar29->u).s.s == (char *)0x0)) {
        initializer = (pnVar29->op_link).next;
        if ((initializer != (node_t)0x0) &&
           ((n = (node_t_conflict)(ulong)initializer->code, initializer->code - N_STR < 3 &&
            (ptVar5->mode == TM_ARR)))) goto LAB_001a773e;
        goto LAB_001a7784;
      }
    }
    else {
LAB_001a7784:
      if (pnVar23->code != N_INIT) goto LAB_001a7f96;
    }
    pnVar29 = (pnVar23->u).ops.head;
    if (pnVar29->code != N_LIST) {
      __assert_fail("des_list->code == N_LIST",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf4,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (ptVar5->mode - TM_STRUCT < 3) {
      pVVar22 = c2m_ctx->init_object_path;
      if (pVVar22 == (VARR_init_object_t *)0x0) goto LAB_001a8069;
      sVar27 = pVVar22->els_num;
      if (ptVar5->mode == TM_ARR) {
        mVar16 = get_arr_type_size(ptVar5);
        if (mVar16 < 0) goto LAB_001a8082;
        pVVar22 = c2m_ctx->init_object_path;
        mVar16 = -1;
        sVar26 = pVVar22->els_num;
      }
      else {
        mVar16 = 0;
        sVar26 = sVar27;
      }
      piVar18 = pVVar22->varr;
      if (piVar18 == (init_object_t *)0x0) goto LAB_001a806e;
      uVar19 = sVar26 + 1;
      if (pVVar22->size < uVar19) {
        sVar26 = (uVar19 >> 1) + uVar19;
        piVar18 = (init_object_t *)realloc(piVar18,sVar26 * 0x18);
        pVVar22->varr = piVar18;
        pVVar22->size = sVar26;
        sVar26 = pVVar22->els_num;
        uVar19 = sVar26 + 1;
      }
      pVVar22->els_num = uVar19;
      piVar18[sVar26].container_type = ptVar5;
      piVar18[sVar26].field_designator_p = 0;
      piVar18[sVar26].u.curr_index = mVar16;
      do {
        if (pnVar23->code != N_INIT) {
          __assert_fail("init->code == N_INIT",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d09,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar29 = (pnVar23->u).ops.head;
        pnVar15 = (pnVar29->op_link).next;
        if (((pnVar15->code == N_LIST) || (pnVar15->code == N_COMPOUND_LITERAL)) &&
           (2 < ptVar5->mode - TM_STRUCT)) {
          __assert_fail("(value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR || type->mode == TM_STRUCT || type->mode == TM_UNION"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                        ,0x2d0d,
                        "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                       );
        }
        pnVar29 = (pnVar29->u).ops.head;
        if (pnVar29 == (node_t)0x0) {
          pVar30 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                (node_t_conflict)(ulong)pnVar23->uid);
          iVar14 = update_path_and_do(c2m_ctx,1,collect_init_els,sVar27,pnVar15,const_only_p,
                                      (mir_llong *)0x0,pVar30,"");
          if (iVar14 == 0) {
            __assert_fail("ok_p",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2d11,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
        }
        else {
          pVVar22 = c2m_ctx->init_object_path;
          if (((pVVar22 == (VARR_init_object_t *)0x0) || (pVVar22->varr == (init_object_t *)0x0)) ||
             (pVVar22->els_num < sVar27 + 1)) {
            collect_init_els_cold_7();
LAB_001a7f96:
            __assert_fail("init->code == N_INIT",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2cf2,
                          "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                         );
          }
          pVVar22->els_num = sVar27 + 1;
          bVar12 = false;
          ptVar28 = ptVar5;
          do {
            pVVar22 = c2m_ctx->init_object_path;
            if (((pVVar22 == (VARR_init_object_t *)0x0) ||
                (piVar18 = pVVar22->varr, piVar18 == (init_object_t *)0x0)) ||
               (sVar26 = pVVar22->els_num, sVar26 == 0)) {
              collect_init_els_cold_6();
              goto LAB_001a7eb3;
            }
            uVar2 = *(undefined4 *)&piVar18[sVar26 - 1].field_0xc;
            if (bVar12) {
              tVar3 = (piVar18[sVar26 - 1].container_type)->mode;
              if (tVar3 - TM_STRUCT < 2) {
                ptVar28 = *(type **)((long)(piVar18[sVar26 - 1].u.curr_member)->attr + 0x40);
              }
              else {
                if (tVar3 != TM_ARR) goto LAB_001a7f53;
                ptVar28 = (((piVar18[sVar26 - 1].container_type)->u).ptr_type)->arr_type;
              }
            }
            else {
              pVVar22->els_num = sVar26 - 1;
            }
            if (pnVar29->code == N_FIELD_ID) {
              if ((ptVar28->mode & ~TM_BASIC) != TM_STRUCT) {
                __assert_fail("curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2a,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              pcStack_88 = (pnVar29->u).s.s;
              pnStack_80 = (ptVar28->u).tag_type;
              local_90 = 0;
              auVar11._4_8_ = pcStack_88;
              auVar11._0_4_ = uStack_8c;
              auVar11._12_8_ = pnStack_80;
              auVar11._20_8_ = uStack_78;
              auVar11._28_8_ = uStack_70;
              auVar11._36_8_ = uStack_68;
              auVar11._44_4_ = 0;
              iVar14 = HTAB_symbol_t_do(c2m_ctx->symbol_tab,(symbol_t)(auVar11 << 0x20),HTAB_FIND,
                                        &el);
              if (iVar14 == 0) {
                __assert_fail("found_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d2c,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              process_init_field_designator(c2m_ctx,el.def_node,ptVar28);
              pnVar6 = (pnVar29->op_link).next;
              pVar30 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                    (node_t_conflict)(ulong)pnVar23->uid);
              iVar14 = update_path_and_do(c2m_ctx,(uint)(pnVar6 == (node_t)0x0),collect_init_els,
                                          sVar27,pnVar15,const_only_p,(mir_llong *)0x0,pVar30,"");
              if (iVar14 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d30,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            else {
              if ((ptVar28->mode != TM_ARR) || (pbVar7 = (byte *)pnVar29->attr, (*pbVar7 & 1) == 0))
              {
LAB_001a7eb3:
                __assert_fail("curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type) && !incomplete_type_p (c2m_ctx, curr_type) && (arr_size_val = get_arr_type_size (curr_type)) >= 0 && (mir_ullong) arr_size_val > cexpr->c.u_val"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d37,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              iVar14 = *(int *)(*(long *)(pbVar7 + 0x18) + 0x18);
              if ((((iVar14 != 2) &&
                   ((iVar14 != 1 || (*(int *)(*(long *)(pbVar7 + 0x18) + 0x30) - 0xeU < 0xfffffff4))
                   )) || (iVar14 = incomplete_type_p(c2m_ctx,ptVar28), iVar14 != 0)) ||
                 ((uVar19 = get_arr_type_size(ptVar28), (long)uVar19 < 0 ||
                  (uVar24 = *(ulong *)(pbVar7 + 0x30), uVar19 <= uVar24)))) goto LAB_001a7eb3;
              pVVar22 = c2m_ctx->init_object_path;
              piVar18 = pVVar22->varr;
              if (piVar18 == (init_object_t *)0x0) {
                collect_init_els_cold_5();
LAB_001a7f53:
                __assert_fail("init_object.container_type->mode == TM_STRUCT || init_object.container_type->mode == TM_UNION"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d21,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
              sVar26 = pVVar22->els_num;
              uVar19 = sVar26 + 1;
              if (pVVar22->size < uVar19) {
                sVar26 = (uVar19 >> 1) + uVar19;
                piVar18 = (init_object_t *)realloc(piVar18,sVar26 * 0x18);
                pVVar22->varr = piVar18;
                pVVar22->size = sVar26;
                sVar26 = pVVar22->els_num;
                uVar19 = sVar26 + 1;
              }
              pVVar22->els_num = uVar19;
              piVar18[sVar26].container_type = ptVar28;
              piVar18[sVar26].field_designator_p = 0;
              *(undefined4 *)&piVar18[sVar26].field_0xc = uVar2;
              piVar18[sVar26].u.curr_member = (node_t_conflict)(uVar24 - 1);
              pnVar6 = (pnVar29->op_link).next;
              pVar30 = get_node_pos((c2m_ctx_t)c2m_ctx->node_positions,
                                    (node_t_conflict)(ulong)pnVar23->uid);
              iVar14 = update_path_and_do(c2m_ctx,(uint)(pnVar6 == (node_t)0x0),collect_init_els,
                                          sVar27,pnVar15,const_only_p,(mir_llong *)0x0,pVar30,"");
              if (iVar14 == 0) {
                __assert_fail("ok_p",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                              ,0x2d3e,
                              "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)"
                             );
              }
            }
            pnVar29 = (pnVar29->op_link).next;
            bVar12 = true;
          } while (pnVar29 != (node_t)0x0);
        }
        pnVar23 = (pnVar23->op_link).next;
      } while (pnVar23 != (node_t)0x0);
      pVVar22 = c2m_ctx->init_object_path;
      if (((pVVar22 != (VARR_init_object_t *)0x0) && (pVVar22->varr != (init_object_t *)0x0)) &&
         (sVar27 <= pVVar22->els_num)) {
        pVVar22->els_num = sVar27;
        return;
      }
      collect_init_els_cold_8();
LAB_001a8055:
      collect_init_els_cold_14();
LAB_001a805a:
      collect_init_els_cold_13();
LAB_001a805f:
      collect_init_els_cold_12();
LAB_001a8064:
      collect_init_els_cold_11();
LAB_001a8069:
      collect_init_els_cold_10();
LAB_001a806e:
      collect_init_els_cold_9();
LAB_001a8073:
      collect_init_els_cold_4();
LAB_001a8078:
      collect_init_els_cold_3();
LAB_001a807d:
      collect_init_els_cold_2();
LAB_001a8082:
      __assert_fail("size_val >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2d02,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    if (((pnVar23->op_link).next != (node_t)0x0) || ((pnVar29->u).s.s != (char *)0x0)) {
      __assert_fail("NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf6,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
    initializer = (pnVar29->op_link).next;
    bVar12 = true;
    if (bVar10) {
      __assert_fail("top_p",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                    ,0x2cf8,
                    "void collect_init_els(c2m_ctx_t, decl_t, struct type **, node_t, int, int)");
    }
  } while( true );
}

Assistant:

static void collect_init_els (c2m_ctx_t c2m_ctx, decl_t member_decl, struct type **type_ptr,
                              node_t initializer, int const_only_p, int top_p MIR_UNUSED) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  struct type *type = *type_ptr;
  struct expr *cexpr;
  node_t literal, des_list, curr_des, str, init, value;
  mir_llong MIR_UNUSED size_val = 0; /* to remove an uninitialized warning */
  size_t mark;
  symbol_t sym;
  init_el_t init_el;
  int addr_p = FALSE; /* to remove an uninitialized warning */
  int MIR_UNUSED found_p, MIR_UNUSED ok_p;
  init_object_t init_object;

  literal = get_compound_literal (initializer, &addr_p);
  if (literal != NULL && !addr_p && initializer->code != N_STR && initializer->code != N_STR16
      && initializer->code != N_STR32)
    initializer = NL_EL (literal->u.ops, 1);
check_one_value:
  if (initializer->code != N_LIST
      && !(initializer->code == N_STR && type->mode == TM_ARR
           && init_compatible_string_p (initializer, type->u.arr_type->el_type))) {
    cexpr = initializer->attr;
    /* static or thread local object initialization should be const expr or addr: */
    assert (initializer->code == N_STR || initializer->code == N_STR16
            || initializer->code == N_STR32 || !const_only_p || cexpr->const_p
            || cexpr->const_addr_p || (literal != NULL && addr_p));
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = member_decl;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = initializer;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  init = NL_HEAD (initializer->u.ops);
  if (((str = initializer)->code == N_STR || str->code == N_STR16
       || str->code == N_STR32 /* string or string in parentheses  */
       || (init != NULL && init->code == N_INIT && NL_EL (initializer->u.ops, 1) == NULL
           && (des_list = NL_HEAD (init->u.ops))->code == N_LIST
           && NL_HEAD (des_list->u.ops) == NULL && NL_EL (init->u.ops, 1) != NULL
           && ((str = NL_EL (init->u.ops, 1))->code == N_STR || str->code == N_STR16
               || str->code == N_STR32)))
      && type->mode == TM_ARR && init_compatible_string_p (str, type->u.arr_type->el_type)) {
    init_el.c2m_ctx = c2m_ctx;
    init_el.num = VARR_LENGTH (init_el_t, init_els);
    init_el.offset = get_object_path_offset (c2m_ctx);
    init_el.member_decl = NULL;
    init_el.el_type = type;
    init_el.container_type = VARR_LENGTH (init_object_t, init_object_path) == 0
                               ? NULL
                               : VARR_LAST (init_object_t, init_object_path).container_type;
    init_el.init = str;
    VARR_PUSH (init_el_t, init_els, init_el);
    return;
  }
  if (init == NULL) return;
  assert (init->code == N_INIT);
  des_list = NL_HEAD (init->u.ops);
  assert (des_list->code == N_LIST);
  if (type->mode != TM_ARR && type->mode != TM_STRUCT && type->mode != TM_UNION) {
    assert (NL_NEXT (init) == NULL && NL_HEAD (des_list->u.ops) == NULL);
    initializer = NL_NEXT (des_list);
    assert (top_p);
    top_p = FALSE;
    goto check_one_value;
  }
  mark = VARR_LENGTH (init_object_t, init_object_path);
  init_object.container_type = type;
  init_object.field_designator_p = FALSE;
  if (type->mode == TM_ARR) {
    size_val = get_arr_type_size (type);
    /* we already figured out the array size during check: */
    assert (size_val >= 0);
    init_object.u.curr_index = -1;
  } else {
    init_object.u.curr_member = NULL;
  }
  VARR_PUSH (init_object_t, init_object_path, init_object);
  for (; init != NULL; init = NL_NEXT (init)) {
    assert (init->code == N_INIT);
    des_list = NL_HEAD (init->u.ops);
    value = NL_NEXT (des_list);
    assert ((value->code != N_LIST && value->code != N_COMPOUND_LITERAL) || type->mode == TM_ARR
            || type->mode == TM_STRUCT || type->mode == TM_UNION);
    if ((curr_des = NL_HEAD (des_list->u.ops)) == NULL) {
      ok_p = update_path_and_do (c2m_ctx, TRUE, collect_init_els, mark, value, const_only_p, NULL,
                                 POS (init), "");
      assert (ok_p);
    } else {
      struct type *curr_type = type;
      mir_llong arr_size_val MIR_UNUSED;
      int first_p = TRUE;

      VARR_TRUNC (init_object_t, init_object_path, mark + 1);
      for (; curr_des != NULL; curr_des = NL_NEXT (curr_des), first_p = FALSE) {
        init_object = VARR_LAST (init_object_t, init_object_path);
        if (first_p) {
          VARR_POP (init_object_t, init_object_path);
        } else {
          if (init_object.container_type->mode == TM_ARR) {
            curr_type = init_object.container_type->u.arr_type->el_type;
          } else {
            assert (init_object.container_type->mode == TM_STRUCT
                    || init_object.container_type->mode == TM_UNION);
            decl_t el_decl = init_object.u.curr_member->attr;
            curr_type = el_decl->decl_spec.type;
          }
        }
        if (curr_des->code == N_FIELD_ID) {
          node_t id = NL_HEAD (curr_des->u.ops);

          /* field should be only in struct/union initializer */
          assert (curr_type->mode == TM_STRUCT || curr_type->mode == TM_UNION);
          found_p = symbol_find (c2m_ctx, S_REGULAR, id, curr_type->u.tag_type, &sym);
          assert (found_p); /* field should present */
          process_init_field_designator (c2m_ctx, sym.def_node, curr_type);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        } else {
          cexpr = curr_des->attr;
          /* index should be in array initializer and const expr of right type and value: */
          assert (curr_type->mode == TM_ARR && cexpr->const_p && integer_type_p (cexpr->type)
                  && !incomplete_type_p (c2m_ctx, curr_type)
                  && (arr_size_val = get_arr_type_size (curr_type)) >= 0
                  && (mir_ullong) arr_size_val > cexpr->c.u_val);
          init_object.u.curr_index = cexpr->c.i_val - 1;
          init_object.field_designator_p = FALSE;
          init_object.container_type = curr_type;
          VARR_PUSH (init_object_t, init_object_path, init_object);
          ok_p = update_path_and_do (c2m_ctx, NL_NEXT (curr_des) == NULL, collect_init_els, mark,
                                     value, const_only_p, NULL, POS (init), "");
          assert (ok_p);
        }
      }
    }
  }
  VARR_TRUNC (init_object_t, init_object_path, mark);
}